

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  ulong uVar3;
  int fragNdx;
  int fragNdx_00;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  Vec4 coord;
  float local_40;
  float local_3c;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar3 = uVar5;
  }
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_40,packets + uVar4,context,0,fragNdx_00);
      fVar7 = (local_40 + local_3c) * 0.5;
      fVar6 = (local_40 - local_3c) * 0.5 + 0.5;
      pGVar1 = context->outputArray;
      iVar2 = ((int)uVar5 + fragNdx_00) * context->numFragmentOutputs;
      pGVar1[iVar2].v.fData[0] = fVar7;
      pGVar1[iVar2].v.fData[1] = fVar6;
      *(ulong *)((long)&pGVar1[iVar2].v + 8) = CONCAT44(1.0 - fVar6,1.0 - fVar7);
    }
    uVar5 = (ulong)((int)uVar5 + 4);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			const float			x		= coord.x();
			const float			y		= coord.y();
			const float			f0		= (x + y) * 0.5f;
			const float			f1		= 0.5f + (x - y) * 0.5f;

			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(f0, f1, 1.0f-f0, 1.0f-f1));
		}
	}